

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd.c
# Opt level: O2

size_t ZSTD_crossEntropyCost(short *norm,uint accuracyLog,uint *count,uint max)

{
  byte bVar1;
  ulong uVar2;
  short sVar3;
  uint uVar4;
  uint uVar5;
  
  if (7 < accuracyLog && accuracyLog - 8 != 0) {
    __assert_fail("accuracyLog <= 8",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                  ,0x2422,
                  "size_t ZSTD_crossEntropyCost(const short *, unsigned int, const unsigned int *, const unsigned int)"
                 );
  }
  uVar5 = 0;
  uVar2 = 0;
  while( true ) {
    if (max < uVar5) {
      return uVar2 >> 8;
    }
    sVar3 = norm[uVar5];
    if (sVar3 == -1) {
      sVar3 = 1;
    }
    bVar1 = -(char)(accuracyLog - 8) & 0x1f;
    uVar4 = (int)sVar3 << bVar1;
    if ((int)sVar3 << bVar1 == 0) break;
    if (0xff < uVar4) {
      __assert_fail("norm256 < 256",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                    ,0x2427,
                    "size_t ZSTD_crossEntropyCost(const short *, unsigned int, const unsigned int *, const unsigned int)"
                   );
    }
    uVar2 = uVar2 + kInverseProbabilityLog256[uVar4] * count[uVar5];
    uVar5 = uVar5 + 1;
  }
  __assert_fail("norm256 > 0",
                "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                ,0x2426,
                "size_t ZSTD_crossEntropyCost(const short *, unsigned int, const unsigned int *, const unsigned int)"
               );
}

Assistant:

size_t ZSTD_crossEntropyCost(short const* norm, unsigned accuracyLog,
                             unsigned const* count, unsigned const max)
{
    unsigned const shift = 8 - accuracyLog;
    size_t cost = 0;
    unsigned s;
    assert(accuracyLog <= 8);
    for (s = 0; s <= max; ++s) {
        unsigned const normAcc = norm[s] != -1 ? norm[s] : 1;
        unsigned const norm256 = normAcc << shift;
        assert(norm256 > 0);
        assert(norm256 < 256);
        cost += count[s] * kInverseProbabilityLog256[norm256];
    }
    return cost >> 8;
}